

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  long *plVar1;
  char cVar2;
  locale *plVar3;
  num_writer f;
  char cVar4;
  numpunct *pnVar5;
  long *plVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  string_view prefix;
  undefined1 auVar14 [16];
  string groups;
  locale local_a0 [8];
  ulong local_98;
  ulong local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  ulong local_68;
  ulong uStack_60;
  int local_58;
  undefined4 uStack_54;
  long **pplStack_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  
  plVar3 = (locale *)(this->writer->locale_).locale_;
  if (plVar3 == (locale *)0x0) {
    std::locale::locale(local_a0);
  }
  else {
    std::locale::locale(local_a0,plVar3);
  }
  pnVar5 = std::use_facet<std::__cxx11::numpunct<char>>(local_a0);
  (**(code **)(*(long *)pnVar5 + 0x20))(&local_88,pnVar5);
  std::locale::~locale(local_a0);
  if (local_80 == 0) {
    on_dec(this);
  }
  else {
    plVar3 = (locale *)(this->writer->locale_).locale_;
    if (plVar3 == (locale *)0x0) {
      std::locale::locale(local_a0);
    }
    else {
      std::locale::locale(local_a0,plVar3);
    }
    pnVar5 = std::use_facet<std::__cxx11::numpunct<char>>(local_a0);
    cVar4 = (**(code **)(*(long *)pnVar5 + 0x18))(pnVar5);
    std::locale::~locale(local_a0);
    if (cVar4 == '\0') {
      on_dec(this);
    }
    else {
      local_68 = (ulong)this->abs_value;
      uStack_60 = *(ulong *)((long)&this->abs_value + 8);
      auVar14 = (undefined1  [16])this->abs_value;
      iVar12 = 1;
      if ((local_68 < 10) <= uStack_60) {
        iVar13 = 4;
        local_98 = uStack_60;
        local_90 = local_68;
        do {
          iVar12 = iVar13;
          uVar11 = auVar14._8_8_;
          uVar10 = auVar14._0_8_;
          local_68 = local_90;
          uStack_60 = local_98;
          if (uVar11 == 0 && (ulong)(99 < uVar10) <= -uVar11) {
            iVar12 = iVar12 + -2;
            goto LAB_0013cc4d;
          }
          if (uVar11 == 0 && (ulong)(999 < uVar10) <= -uVar11) {
            iVar12 = iVar12 + -1;
            goto LAB_0013cc4d;
          }
          if (uVar11 < (uVar10 < 10000)) goto LAB_0013cc4d;
          auVar14 = __udivti3(uVar10,uVar11,10000,0);
          iVar13 = iVar12 + 4;
        } while (uVar11 != 0 || -uVar11 < (ulong)(99999 < uVar10));
        iVar12 = iVar12 + 1;
        local_68 = local_90;
        uStack_60 = local_98;
      }
LAB_0013cc4d:
      pplStack_50 = &local_88;
      plVar1 = (long *)((long)local_88 + local_80);
      plVar7 = local_88;
      iVar13 = iVar12;
      local_58 = iVar12;
      if (local_80 != 0) {
        iVar8 = iVar12 + (int)local_80;
        plVar6 = local_88;
        do {
          cVar2 = (char)*plVar6;
          iVar9 = iVar13 - cVar2;
          plVar7 = plVar6;
          local_58 = iVar12;
          if ((iVar9 == 0 || iVar13 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          iVar12 = iVar12 + 1;
          plVar6 = (long *)((long)plVar6 + 1);
          local_80 = local_80 + -1;
          plVar7 = plVar1;
          iVar13 = iVar9;
          local_58 = iVar8;
        } while (local_80 != 0);
      }
      if (plVar7 == plVar1) {
        local_58 = local_58 + (iVar13 + -1) / (int)*(char *)((long)plVar1 + -1);
      }
      f._20_4_ = uStack_54;
      f.size = local_58;
      f._33_7_ = uStack_47;
      f.sep = cVar4;
      f.abs_value._8_8_ = uStack_60;
      f.abs_value._0_8_ = local_68;
      f.groups = (string *)pplStack_50;
      f._40_8_ = uStack_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      local_48 = cVar4;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,local_58,prefix,
                 *this->specs,f);
    }
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }